

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_function.cpp
# Opt level: O3

char * prototype_string(glsl_type *return_type,char *name,exec_list *parameters)

{
  char *pcVar1;
  exec_node *peVar2;
  char *str;
  char *local_28;
  
  local_28 = (char *)0x0;
  if (return_type != (glsl_type *)0x0) {
    local_28 = ralloc_asprintf((void *)0x0,"%s ",return_type->name);
  }
  ralloc_asprintf_append(&local_28,"%s(",name);
  peVar2 = (parameters->head_sentinel).next;
  if (peVar2->next != (exec_node *)0x0) {
    pcVar1 = "";
    do {
      ralloc_asprintf_append(&local_28,"%s%s",pcVar1,peVar2[1].prev[1].next);
      peVar2 = peVar2->next;
      pcVar1 = ", ";
    } while (peVar2->next != (exec_node *)0x0);
  }
  ralloc_strcat(&local_28,")");
  return local_28;
}

Assistant:

char *
prototype_string(const glsl_type *return_type, const char *name,
                 exec_list *parameters)
{
   char *str = NULL;

   if (return_type != NULL)
      str = ralloc_asprintf(NULL, "%s ", return_type->name);

   ralloc_asprintf_append(&str, "%s(", name);

   const char *comma = "";
   foreach_in_list(const ir_variable, param, parameters) {
      ralloc_asprintf_append(&str, "%s%s", comma, param->type->name);
      comma = ", ";
   }

   ralloc_strcat(&str, ")");
   return str;
}